

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easm_print.c
# Opt level: O1

void easm_print_sexpr(FILE *out,envy_colors *cols,easm_expr *expr,int lvl)

{
  easm_expr_type eVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  char *__format;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  
LAB_0024f22b:
  do {
    switch(expr->special) {
    case EASM_SPEC_NONE:
    case EASM_SPEC_LITERAL:
      pcVar3 = (char *)0x0;
      goto LAB_0024f265;
    case EASM_SPEC_ERR:
      lVar2 = 0x70;
      break;
    case EASM_SPEC_BTARG:
      lVar2 = 0x48;
      break;
    case EASM_SPEC_CTARG:
      lVar2 = 0x50;
      break;
    case EASM_SPEC_REGSP:
      lVar2 = 0x30;
      break;
    default:
switchD_0024f241_default:
      abort();
    }
    pcVar3 = *(char **)((long)&cols->reset + lVar2);
LAB_0024f265:
    if ((lvl < 0) && (expr->type == EASM_EXPR_VEC)) break;
    if (lvl < 1) {
      if (expr->type == EASM_EXPR_SUB) {
        easm_print_sexpr(out,cols,expr->e1,0);
        pcVar3 = cols->sym;
        pcVar4 = "%s-%s";
      }
      else {
        if (expr->type != EASM_EXPR_ADD) goto LAB_0024f27d;
        easm_print_sexpr(out,cols,expr->e1,0);
        pcVar3 = cols->sym;
        pcVar4 = "%s+%s";
      }
      fprintf((FILE *)out,pcVar4,pcVar3);
      expr = expr->e2;
      lvl = 1;
      goto LAB_0024f22b;
    }
LAB_0024f27d:
    if (lvl < 2) {
      eVar1 = expr->type;
      if (eVar1 == EASM_EXPR_MOD) {
        easm_print_sexpr(out,cols,expr->e1,1);
        pcVar3 = cols->sym;
        pcVar4 = "%s%%%s";
      }
      else if (eVar1 == EASM_EXPR_DIV) {
        easm_print_sexpr(out,cols,expr->e1,1);
        pcVar3 = cols->sym;
        pcVar4 = "%s/%s";
      }
      else {
        if (eVar1 != EASM_EXPR_MUL) goto LAB_0024f2c7;
        easm_print_sexpr(out,cols,expr->e1,1);
        pcVar3 = cols->sym;
        pcVar4 = "%s*%s";
      }
      fprintf((FILE *)out,pcVar4,pcVar3);
      expr = expr->e2;
      lvl = 2;
    }
    else {
LAB_0024f2c7:
      if (2 < lvl) {
LAB_0024f44d:
        eVar1 = expr->type;
        switch(eVar1) {
        case EASM_EXPR_NUM:
          pcVar4 = pcVar3;
          if (pcVar3 == (char *)0x0) {
            pcVar4 = cols->num;
          }
          fprintf((FILE *)out,"%s0x%lx%s",pcVar4,expr->num,cols->reset);
          pcVar5 = expr->alabel;
          if (pcVar5 == (char *)0x0) {
            return;
          }
          pcVar4 = cols->reset;
          pcVar6 = cols->comm;
          if (pcVar3 == (char *)0x0) {
            pcVar3 = cols->num;
          }
          __format = " %s/*%s %s#%s%s %s*/%s";
          goto LAB_0024f7ab;
        case EASM_EXPR_REG:
          if (pcVar3 == (char *)0x0) {
            pcVar3 = cols->reg;
          }
          pcVar4 = expr->str;
          pcVar6 = cols->reset;
          pcVar5 = "%s$%s%s";
          goto LAB_0024f671;
        case EASM_EXPR_LABEL:
          if (pcVar3 == (char *)0x0) {
            pcVar3 = cols->num;
          }
          pcVar4 = expr->str;
          pcVar6 = cols->reset;
          pcVar5 = "%s#%s%s";
LAB_0024f671:
          fprintf((FILE *)out,pcVar5,pcVar3,pcVar4,pcVar6);
          return;
        case EASM_EXPR_STR:
          if (pcVar3 == (char *)0x0) {
            pcVar3 = cols->num;
          }
          fputs(pcVar3,(FILE *)out);
          print_escaped_astr(out,&expr->astr);
          goto LAB_0024f6af;
        case EASM_EXPR_DISCARD:
          pcVar3 = cols->reset;
          pcVar4 = cols->sym;
          pcVar6 = "%s#%s";
          break;
        case EASM_EXPR_SINSN:
          fprintf((FILE *)out,"%s(%s",cols->sym,cols->reset);
          easm_print_sinsn(out,cols,expr->sinsn);
LAB_0024f569:
          pcVar3 = cols->reset;
          pcVar4 = cols->sym;
          pcVar6 = "%s)%s";
          break;
        case EASM_EXPR_SWIZZLE:
          easm_print_sexpr(out,cols,expr->e1,3);
          fprintf((FILE *)out,"%s.",cols->rname);
          if (expr->swizzlesnum != 1) {
            fputc(0x28,(FILE *)out);
          }
          if (expr->swizzlesnum < 1) goto LAB_0024f638;
          lVar7 = 0;
          lVar2 = 0;
          do {
            if (lVar7 != 0) {
              fputc(0x20,(FILE *)out);
            }
            pcVar3 = *(char **)((long)&expr->swizzles->str + lVar7);
            if (pcVar3 == (char *)0x0) {
              fprintf((FILE *)out,"%lu",*(undefined8 *)((long)&expr->swizzles->num + lVar7));
            }
            else {
              fputs(pcVar3,(FILE *)out);
            }
            lVar2 = lVar2 + 1;
            lVar7 = lVar7 + 0x10;
          } while (lVar2 < expr->swizzlesnum);
          if (expr->swizzlesnum != 1) {
LAB_0024f638:
            fputc(0x29,(FILE *)out);
          }
LAB_0024f6af:
          fputs(cols->reset,(FILE *)out);
          return;
        default:
          if (4 < eVar1 - EASM_EXPR_MEM) {
            pcVar3 = cols->reset;
            pcVar4 = cols->sym;
            if (eVar1 == EASM_EXPR_POS) {
              pcVar6 = "%s$%s";
              break;
            }
            fprintf((FILE *)out,"%s(%s",pcVar4,pcVar3);
            easm_print_expr(out,cols,expr,-1);
            goto LAB_0024f569;
          }
          pcVar4 = "";
          if (expr->str != (char *)0x0) {
            pcVar4 = expr->str;
          }
          fprintf((FILE *)out,"%s%s[%s",cols->mem,pcVar4,cols->reset);
          easm_print_mods(out,cols,expr->mods,1);
          easm_print_expr(out,cols,expr->e1,-1);
          switch(expr->type) {
          case EASM_EXPR_MEM:
            goto switchD_0024f534_caseD_17;
          case EASM_EXPR_MEMPP:
            pcVar4 = "%s++%s";
            break;
          case EASM_EXPR_MEMMM:
            pcVar4 = "%s--%s";
            break;
          case EASM_EXPR_MEMPE:
            pcVar4 = "%s+=%s";
            break;
          case EASM_EXPR_MEMME:
            pcVar4 = "%s-=%s";
            break;
          default:
            goto switchD_0024f241_default;
          }
          fprintf((FILE *)out,pcVar4,cols->mem,cols->reset);
          easm_print_expr(out,cols,expr->e2,-1);
switchD_0024f534_caseD_17:
          fprintf((FILE *)out,"%s]%s",cols->mem,cols->reset);
          if (expr->special != EASM_SPEC_LITERAL) {
            return;
          }
          pcVar4 = cols->reset;
          pcVar6 = cols->comm;
          if (pcVar3 == (char *)0x0) {
            pcVar3 = cols->num;
          }
          pcVar5 = (char *)expr->alit;
          __format = " %s/*%s %s0x%lx%s %s*/%s";
LAB_0024f7ab:
          fprintf((FILE *)out,__format,pcVar6,pcVar4,pcVar3,pcVar5,pcVar4,pcVar6,pcVar4);
          return;
        case EASM_EXPR_ZVEC:
          pcVar3 = cols->reset;
          pcVar4 = cols->sym;
          pcVar6 = "%s()%s";
        }
        fprintf((FILE *)out,pcVar6,pcVar4,pcVar3);
        return;
      }
      eVar1 = expr->type;
      if (eVar1 == EASM_EXPR_LNOT) {
        pcVar3 = cols->sym;
        pcVar4 = "%s!%s";
      }
      else if (eVar1 == EASM_EXPR_NOT) {
        pcVar3 = cols->sym;
        pcVar4 = "%s~%s";
      }
      else {
        if (eVar1 != EASM_EXPR_NEG) goto LAB_0024f44d;
        pcVar3 = cols->sym;
        pcVar4 = "%s-%s";
      }
      fprintf((FILE *)out,pcVar4,pcVar3);
      expr = expr->e1;
      lvl = 2;
    }
  } while( true );
  easm_print_sexpr(out,cols,expr->e1,-1);
  lvl = 0;
  fprintf((FILE *)out,"%s:%s",cols->sym);
  expr = expr->e2;
  goto LAB_0024f22b;
}

Assistant:

void easm_print_sexpr(FILE *out, const struct envy_colors *cols, struct easm_expr *expr, int lvl) {
	const char *scol = 0;
	switch (expr->special) {
		case EASM_SPEC_NONE:
		case EASM_SPEC_LITERAL:
			break;
		case EASM_SPEC_ERR:
			scol = cols->err;
			break;
		case EASM_SPEC_BTARG:
			scol = cols->btarg;
			break;
		case EASM_SPEC_CTARG:
			scol = cols->ctarg;
			break;
		case EASM_SPEC_REGSP:
			scol = cols->regsp;
			break;
		default:
			abort();
	}
	if (lvl <= -1 && expr->type == EASM_EXPR_VEC) {
		easm_print_sexpr(out, cols, expr->e1, -1);
		fprintf(out, "%s:%s", cols->sym, cols->reset);
		easm_print_sexpr(out, cols, expr->e2, 0);
	} else if (lvl <= 0 && expr->type == EASM_EXPR_ADD) {
		easm_print_sexpr(out, cols, expr->e1, 0);
		fprintf(out, "%s+%s", cols->sym, cols->reset);
		easm_print_sexpr(out, cols, expr->e2, 1);
	} else if (lvl <= 0 && expr->type == EASM_EXPR_SUB) {
		easm_print_sexpr(out, cols, expr->e1, 0);
		fprintf(out, "%s-%s", cols->sym, cols->reset);
		easm_print_sexpr(out, cols, expr->e2, 1);
	} else if (lvl <= 1 && expr->type == EASM_EXPR_MUL) {
		easm_print_sexpr(out, cols, expr->e1, 1);
		fprintf(out, "%s*%s", cols->sym, cols->reset);
		easm_print_sexpr(out, cols, expr->e2, 2);
	} else if (lvl <= 1 && expr->type == EASM_EXPR_DIV) {
		easm_print_sexpr(out, cols, expr->e1, 1);
		fprintf(out, "%s/%s", cols->sym, cols->reset);
		easm_print_sexpr(out, cols, expr->e2, 2);
	} else if (lvl <= 1 && expr->type == EASM_EXPR_MOD) {
		easm_print_sexpr(out, cols, expr->e1, 1);
		fprintf(out, "%s%%%s", cols->sym, cols->reset);
		easm_print_sexpr(out, cols, expr->e2, 2);
	} else if (lvl <= 2 && expr->type == EASM_EXPR_NEG) {
		fprintf(out, "%s-%s", cols->sym, cols->reset);
		easm_print_sexpr(out, cols, expr->e1, 2);
	} else if (lvl <= 2 && expr->type == EASM_EXPR_NOT) {
		fprintf(out, "%s~%s", cols->sym, cols->reset);
		easm_print_sexpr(out, cols, expr->e1, 2);
	} else if (lvl <= 2 && expr->type == EASM_EXPR_LNOT) {
		fprintf(out, "%s!%s", cols->sym, cols->reset);
		easm_print_sexpr(out, cols, expr->e1, 2);
	} else if (expr->type == EASM_EXPR_NUM) {
		fprintf(out, "%s0x%"PRIx64"%s", scol?scol:cols->num, expr->num, cols->reset);
		if (expr->alabel) {
			fprintf(out, " %s/*%s %s#%s%s %s*/%s", cols->comm, cols->reset, scol?scol:cols->num, expr->alabel, cols->reset, cols->comm, cols->reset);
		}
	} else if (expr->type == EASM_EXPR_REG) {
		fprintf(out, "%s$%s%s", scol?scol:cols->reg, expr->str, cols->reset);
	} else if (expr->type == EASM_EXPR_LABEL) {
		fprintf(out, "%s#%s%s", scol?scol:cols->num, expr->str, cols->reset);
	} else if (expr->type == EASM_EXPR_STR) {
		fprintf(out, "%s", scol?scol:cols->num);
		print_escaped_astr(out, &expr->astr);
		fprintf(out, "%s", cols->reset);
	} else if (expr->type == EASM_EXPR_DISCARD) {
		fprintf(out, "%s#%s", cols->sym, cols->reset);
	} else if (expr->type == EASM_EXPR_ZVEC) {
		fprintf(out, "%s()%s", cols->sym, cols->reset);
	} else if (expr->type == EASM_EXPR_SINSN) {
		fprintf(out, "%s(%s", cols->sym, cols->reset);
		easm_print_sinsn(out, cols, expr->sinsn);
		fprintf(out, "%s)%s", cols->sym, cols->reset);
	} else if (expr->type == EASM_EXPR_SWIZZLE) {
		int i;
		easm_print_sexpr(out, cols, expr->e1, 3);
		fprintf(out, "%s.", cols->rname);
		if (expr->swizzlesnum != 1) {
			fprintf(out, "(");
		}
		for (i = 0; i < expr->swizzlesnum; i++) {
			if (i)
				fprintf(out, " ");
			if (expr->swizzles[i].str) {
				fprintf(out, "%s", expr->swizzles[i].str);
			} else {
				fprintf(out, "%"PRIu64, expr->swizzles[i].num);
			}
		}
		if (expr->swizzlesnum != 1) {
			fprintf(out, ")");
		}
		fprintf(out, "%s", cols->reset);
	} else if (expr->type >= EASM_EXPR_MEM && expr->type <= EASM_EXPR_MEMME) {
		fprintf(out, "%s%s[%s", cols->mem, expr->str?expr->str:"", cols->reset);
		easm_print_mods(out, cols, expr->mods, 1);
		easm_print_expr(out, cols, expr->e1, -1);
		if (expr->type != EASM_EXPR_MEM) {
			switch(expr->type) {
				case EASM_EXPR_MEMPP:
					fprintf(out, "%s++%s", cols->mem, cols->reset);
					break;
				case EASM_EXPR_MEMMM:
					fprintf(out, "%s--%s", cols->mem, cols->reset);
					break;
				case EASM_EXPR_MEMPE:
					fprintf(out, "%s+=%s", cols->mem, cols->reset);
					break;
				case EASM_EXPR_MEMME:
					fprintf(out, "%s-=%s", cols->mem, cols->reset);
					break;
				default:
					abort();
			}
			easm_print_expr(out, cols, expr->e2, -1);
		}
		fprintf(out, "%s]%s", cols->mem, cols->reset);
		if (expr->special == EASM_SPEC_LITERAL)
			fprintf(out, " %s/*%s %s0x%"PRIx64"%s %s*/%s", cols->comm, cols->reset, scol?scol:cols->num, expr->alit, cols->reset, cols->comm, cols->reset);
	} else if (expr->type == EASM_EXPR_POS) {
		fprintf(out, "%s$%s", cols->sym, cols->reset);
	} else {
		fprintf(out, "%s(%s", cols->sym, cols->reset);
		easm_print_expr(out, cols, expr, -1);
		fprintf(out, "%s)%s", cols->sym, cols->reset);
	}
}